

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uws_client.c
# Opt level: O0

int send_close_frame(UWS_CLIENT_INSTANCE *uws_client,uint close_error_code)

{
  int iVar1;
  BUFFER_HANDLE handle;
  LOGGER_LOG p_Var2;
  size_t size;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  BUFFER_HANDLE close_frame_buffer;
  int result;
  size_t close_frame_length;
  uchar *puStack_20;
  uchar close_frame_payload [2];
  uchar *close_frame;
  uint close_error_code_local;
  UWS_CLIENT_INSTANCE *uws_client_local;
  
  close_frame_length._6_1_ = (undefined1)(close_error_code >> 8);
  close_frame_length._7_1_ = (undefined1)close_error_code;
  handle = uws_frame_encoder_encode
                     (WS_CLOSE_FRAME,(uchar *)((long)&close_frame_length + 6),2,true,true,'\0');
  if (handle != (BUFFER_HANDLE)0x0) {
    puStack_20 = BUFFER_u_char(handle);
    size = BUFFER_length(handle);
    if ((uws_client == (UWS_CLIENT_INSTANCE *)0x0) ||
       (iVar1 = xio_send(uws_client->underlying_io,puStack_20,size,unchecked_on_send_complete,
                         (void *)0x0), iVar1 != 0)) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/uws_client.c"
                  ,"send_close_frame",0x299,1,"Sending CLOSE frame failed.");
      }
      close_frame_buffer._4_4_ = 0x29a;
    }
    else {
      close_frame_buffer._4_4_ = 0;
    }
    BUFFER_delete(handle);
    return close_frame_buffer._4_4_;
  }
  p_Var2 = xlogging_get_log_function();
  if (p_Var2 != (LOGGER_LOG)0x0) {
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/uws_client.c"
              ,"send_close_frame",0x28d,1,"Encoding of CLOSE failed.");
  }
  return 0x28e;
}

Assistant:

static int send_close_frame(UWS_CLIENT_INSTANCE* uws_client, unsigned int close_error_code)
{
    unsigned char* close_frame;
    unsigned char close_frame_payload[2];
    size_t close_frame_length;
    int result;
    BUFFER_HANDLE close_frame_buffer;

    close_frame_payload[0] = (unsigned char)(close_error_code >> 8);
    close_frame_payload[1] = (unsigned char)(close_error_code & 0xFF);

    /* Codes_SRS_UWS_CLIENT_01_140: [ To avoid confusing network intermediaries (such as intercepting proxies) and for security reasons that are further discussed in Section 10.3, a client MUST mask all frames that it sends to the server (see Section 5.3 for further details). ]*/
    close_frame_buffer = uws_frame_encoder_encode(WS_CLOSE_FRAME, close_frame_payload, sizeof(close_frame_payload), true, true, 0);
    if (close_frame_buffer == NULL)
    {
        LogError("Encoding of CLOSE failed.");
        result = MU_FAILURE;
    }
    else
    {
        close_frame = BUFFER_u_char(close_frame_buffer);
        close_frame_length = BUFFER_length(close_frame_buffer);

        /* Codes_SRS_UWS_CLIENT_01_471: [ The callback on_underlying_io_close_sent shall be passed as argument to xio_send. ]*/
        if (uws_client == NULL ||
            xio_send(uws_client->underlying_io, close_frame, close_frame_length, unchecked_on_send_complete, NULL) != 0)
        {
            LogError("Sending CLOSE frame failed.");
            result = MU_FAILURE;
        }
        else
        {
            result = 0;
        }

        BUFFER_delete(close_frame_buffer);
    }

    return result;
}